

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# overflow.h
# Opt level: O0

_Bool chck_sub_of32(int32_t a,int32_t b,int32_t *r)

{
  int32_t *r_local;
  int32_t b_local;
  int32_t a_local;
  
  if ((-1 < b) && (r != (int32_t *)0x0)) {
    *r = a - b;
    return SBORROW4(a,b);
  }
  __assert_fail("(!1 || b >= 0) && r",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/overflow.h"
                ,0x38,"_Bool chck_sub_of32(int32_t, int32_t, int32_t *)");
}

Assistant:

decl_generics(uint64_t, u64, int64_t, 64)
decl_generics(uint32_t, u32, int32_t, 32)
decl_generics(uint16_t, u16, int16_t, 16)
decl_generics(uint8_t, u8, int8_t, 8)

#pragma GCC diagnostic pop

#undef decl_generics
#undef decl_generics_for_type
#undef add_of
#undef sub_of
#undef mul_of
#undef of_attr

CHCK_MALLOC static inline void*
chck_malloc_add_of(size_t size, size_t add)
{
   size_t r;
   if (unlikely(chck_add_ofsz(size, add, &r)) || !r)
      return NULL;

   return malloc(r);
}

CHCK_MALLOC static inline void*
chck_malloc_sub_of(size_t size, size_t sub)
{
   size_t r;
   if (unlikely(chck_sub_ofsz(size, sub, &r)) || !r)
      return NULL;

   return malloc(r);
}

CHCK_MALLOC static inline void*
chck_malloc_mul_of(size_t size, size_t mul)
{
   size_t r;
   if (unlikely(chck_mul_ofsz(size, mul, &r)) || !r)
      return NULL;

   return malloc(r);
}

CHCK_MALLOC static inline void*
chck_calloc_of(size_t nmemb, size_t size)
{
   size_t r;
   if (unlikely(chck_mul_ofsz(nmemb, size, &r)) || !r)
      return NULL;

   return calloc(nmemb, size);
}

CHCK_MALLOC static inline void*
chck_calloc_add_of(size_t size, size_t add)
{
   size_t r;
   if (unlikely(chck_add_ofsz(size, add, &r)) || !r)
      return NULL;

   return calloc(1, r);
}

CHCK_MALLOC static inline void*
chck_calloc_sub_of(size_t size, size_t sub)
{
   size_t r;
   if (unlikely(chck_sub_ofsz(size, sub, &r)) || !r)
      return NULL;

   return calloc(1, r);
}

static inline void*
chck_realloc_add_of(void *ptr, size_t size, size_t add)
{
   size_t r;
   if (unlikely(chck_add_ofsz(size, add, &r)) || !r)
      return NULL;

   return realloc(ptr, r);
}